

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O3

BlockDivisionInfo *
adios2::helper::DivideBlock
          (BlockDivisionInfo *__return_storage_ptr__,Dims *count,size_t subblockSize,
          BlockDivisionMethod divisionMethod)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  uint uVar5;
  pointer puVar6;
  ulong uVar7;
  ulong __new_size;
  ushort uVar8;
  ulong uVar9;
  bool bVar10;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (divisionMethod != Contiguous) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Helper","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"adiosMath","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"DivideBlock","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "adios2::helper::DivideBlock() only works with Contiguous division method","");
    Throw<std::invalid_argument>(&local_b0,&local_90,&local_50,&local_70,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  puVar1 = (count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar7 = 1;
  puVar6 = puVar1;
  if ((long)puVar2 - (long)puVar1 != 0) {
    do {
      uVar7 = uVar7 * *puVar6;
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  __new_size = (long)puVar2 - (long)puVar1 >> 3;
  uVar7 = uVar7 / subblockSize + (ulong)((uVar7 / subblockSize) * subblockSize < uVar7);
  if (0x1000 < uVar7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "ADIOS WARNING: The StatsBlockSize parameter is causing a data block to be divided up to more than 4096 sub-blocks.  This is an artificial limit to avoid metadata explosion."
               ,0xac);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    uVar7 = 0x1000;
  }
  (__return_storage_ptr__->ReverseDivProduct).
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->ReverseDivProduct).
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Rem).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->Rem).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Div).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->Rem).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Div).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->Div).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->ReverseDivProduct).
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->SubBlockSize = subblockSize;
  __return_storage_ptr__->DivisionMethod = divisionMethod;
  local_b0._M_dataplus._M_p._0_2_ = 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&__return_storage_ptr__->Div,__new_size,(value_type_conflict7 *)&local_b0);
  local_b0._M_dataplus._M_p._0_2_ = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&__return_storage_ptr__->Rem,__new_size,(value_type_conflict7 *)&local_b0);
  local_b0._M_dataplus._M_p._0_2_ = 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&__return_storage_ptr__->ReverseDivProduct,__new_size,(value_type_conflict7 *)&local_b0
            );
  uVar8 = 1;
  if (uVar7 != 0) {
    uVar8 = (ushort)uVar7;
  }
  __return_storage_ptr__->NBlocks = uVar8;
  if (1 < uVar8) {
    if (puVar2 != puVar1 && 1 < uVar7) {
      puVar1 = (count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (__return_storage_ptr__->Div).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = 1;
      do {
        uVar4 = puVar1[uVar9 - 1];
        if ((uVar7 & 0xffff) < uVar4) {
          puVar3[uVar9 - 1] = (ushort)uVar7;
          break;
        }
        uVar8 = (ushort)uVar4;
        uVar5 = (uint)(ushort)uVar7 / (uint)uVar8;
        puVar3[uVar9 - 1] = uVar8;
        if ((ushort)uVar5 < 2) break;
        uVar7 = (ulong)uVar5;
        bVar10 = uVar9 < __new_size;
        uVar9 = uVar9 + 1;
      } while (bVar10);
    }
    CalculateSubblockInfo(count,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BlockDivisionInfo DivideBlock(const Dims &count, const size_t subblockSize,
                              const BlockDivisionMethod divisionMethod)
{
    if (divisionMethod != BlockDivisionMethod::Contiguous)
    {
        helper::Throw<std::invalid_argument>("Helper", "adiosMath", "DivideBlock",
                                             "adios2::helper::DivideBlock() only "
                                             "works with Contiguous division method");
    }
    const size_t ndim = count.size();
    const size_t nElems = helper::GetTotalSize(count);
    size_t nBlocks64 = nElems / subblockSize;
    if (nElems > nBlocks64 * subblockSize)
    {
        ++nBlocks64;
    }
    if (nBlocks64 > 4096)
    {
        std::cerr << "ADIOS WARNING: The StatsBlockSize parameter is causing a "
                     "data block to be divided up to more than 4096 sub-blocks. "
                     " This is an artificial limit to avoid metadata explosion."
                  << std::endl;
        nBlocks64 = 4096;
    }

    BlockDivisionInfo info;
    info.SubBlockSize = subblockSize;
    info.DivisionMethod = divisionMethod;
    info.Div.resize(ndim, 1);
    info.Rem.resize(ndim, 0);
    info.ReverseDivProduct.resize(ndim, 1);
    info.NBlocks = static_cast<uint16_t>(nBlocks64);
    if (info.NBlocks == 0)
    {
        info.NBlocks = 1;
    }

    if (info.NBlocks > 1)
    {
        /* Split the block into 'nBlocks' subblocks */
        /* FIXME: What about column-major dimension order here? */
        size_t i = 0;
        uint16_t n = info.NBlocks;
        size_t dim;
        uint16_t div = 1;
        while (n > 1 && i < ndim)
        {
            dim = count[i];
            if (n < dim)
            {
                div = n;
                n = 1;
            }
            else
            {
                div = static_cast<uint16_t>(dim);
                n = static_cast<uint16_t>(n / dim); // calming VS++
            }
            info.Div[i] = div;
            ++i;
        }
        CalculateSubblockInfo(count, info);
    }
    return info;
}